

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

void Abc_NodeMffcLabel_rec(Abc_Obj_t *pNode,int fTopmost,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  int Fill;
  long lVar7;
  
  if ((fTopmost != 0) ||
     (((uVar5 = *(uint *)&pNode->field_0x14 & 0xf, uVar5 != 2 && (uVar5 != 5)) &&
      ((pNode->vFanouts).nSize < 1)))) {
    pAVar3 = pNode->pNtk;
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vNodes);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar1] = iVar2;
      if (0 < (pNode->vFanins).nSize) {
        lVar7 = 0;
        do {
          Abc_NodeMffcLabel_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]],0,
                     vNodes);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pNode->vFanins).nSize);
      }
      if (vNodes != (Vec_Ptr_t *)0x0) {
        uVar5 = vNodes->nSize;
        if (uVar5 == vNodes->nCap) {
          if ((int)uVar5 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
            }
            vNodes->pArray = ppvVar6;
            vNodes->nCap = uVar5 * 2;
          }
        }
        else {
          ppvVar6 = vNodes->pArray;
        }
        iVar1 = vNodes->nSize;
        vNodes->nSize = iVar1 + 1;
        ppvVar6[iVar1] = pNode;
      }
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcLabel_rec( Abc_Obj_t * pNode, int fTopmost, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
        return;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcLabel_rec( pFanin, 0, vNodes );
    // collect the internal node
//    printf( "%d ", pNode->Id );
    if ( vNodes )
        Vec_PtrPush( vNodes, pNode );
}